

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall Parsing::File::rm(File *this)

{
  char *__filename;
  bool bVar1;
  uint uVar2;
  int iVar3;
  File *this_local;
  
  bVar1 = isFile(this);
  if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    __filename = (char *)std::__cxx11::string::c_str();
    iVar3 = remove(__filename);
    if (iVar3 == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool File::rm() const noexcept
    {
        if (!isFile() || _path.empty())
            return false;
        if (remove(_path.c_str()) != 0)
            return false;
        return true;
    }